

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFTokenizer.cc
# Opt level: O2

void __thiscall qpdf::Tokenizer::inHexstring(Tokenizer *this,char ch)

{
  state_e sVar1;
  char cVar2;
  uint uVar3;
  allocator<char> local_81;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  cVar2 = util::hex_decode_char(ch);
  if (cVar2 < '\x10') {
    this->char_code = (int)cVar2 << 4;
    sVar1 = st_in_hexstring_2nd;
    goto LAB_001aff7a;
  }
  uVar3 = (uint)ch;
  if (uVar3 < 0x3f) {
    if ((0x100003e01U >> ((ulong)uVar3 & 0x3f) & 1) != 0) {
      return;
    }
    if ((ulong)uVar3 != 0x3e) goto LAB_001affb3;
    this->type = tt_string;
  }
  else {
LAB_001affb3:
    this->type = tt_bad;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_60,"invalid character (",&local_81);
    std::operator+(&local_80,&local_60,ch);
    std::operator+(&local_40,&local_80,") in hexstring");
    std::__cxx11::string::operator=((string *)&this->error_message,(string *)&local_40);
    std::__cxx11::string::~string((string *)&local_40);
    std::__cxx11::string::~string((string *)&local_80);
    std::__cxx11::string::~string((string *)&local_60);
  }
  sVar1 = st_token_ready;
LAB_001aff7a:
  this->state = sVar1;
  return;
}

Assistant:

void
Tokenizer::inHexstring(char ch)
{
    if (char hval = util::hex_decode_char(ch); hval < '\20') {
        char_code = int(hval) << 4;
        state = st_in_hexstring_2nd;

    } else if (ch == '>') {
        type = tt::tt_string;
        state = st_token_ready;

    } else if (isSpace(ch)) {
        // ignore

    } else {
        type = tt::tt_bad;
        QTC::TC("qpdf", "QPDFTokenizer bad hexstring character");
        error_message = std::string("invalid character (") + ch + ") in hexstring";
        state = st_token_ready;
    }
}